

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::MultiplyDenseValues(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint8_t *vx;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint8_t *vy;
  uint uVar8;
  PeelColumn *pPVar9;
  uint32_t uVar10;
  ushort *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *vx_00;
  ushort *puVar14;
  uint16_t bits [500];
  uint16_t rows [500];
  uint8_t *local_860;
  uint local_854;
  PCGRandom local_840;
  ulong local_830;
  long local_828;
  ulong local_820;
  ulong local_818;
  long local_810;
  uint16_t local_808 [504];
  ushort local_418;
  ushort local_416 [499];
  
  local_840.Inc = (ulong)this->_d_seed * 2 + 1;
  local_840.State = local_840.Inc * 0x5851f42d4c957f2e;
  uVar1 = this->_block_count;
  if (uVar1 != 0) {
    uVar2 = this->_dense_count;
    uVar13 = (ulong)uVar2;
    local_860 = this->_recovery_blocks;
    pPVar9 = this->_peel_cols;
    local_830 = (ulong)(uVar2 >> 1);
    vx = local_860 + ((uint)this->_mix_count + (uint)uVar1) * this->_block_bytes;
    uVar5 = (ulong)(uVar2 + 1 >> 1);
    local_810 = (long)local_808 + (ulong)(uVar2 + 1 & 0xfffffffe);
    uVar6 = (ulong)(((uVar2 >> 1) - 1) + (uVar2 & 1));
    local_828 = uVar13 * 3;
    uVar4 = 0;
    local_820 = uVar13;
    do {
      local_854 = (uint)uVar1;
      uVar10 = (uint32_t)uVar13;
      local_818 = (ulong)(uVar4 + uVar10);
      uVar8 = this->_block_count - uVar4;
      if (uVar4 + uVar10 <= (uint)uVar1) {
        uVar8 = uVar10;
      }
      ShuffleDeck16(&local_840,&local_418,uVar10);
      ShuffleDeck16(&local_840,local_808,uVar10);
      if ((ushort)uVar13 == 0) {
LAB_00104b1b:
        memset(vx,0,(ulong)this->_block_bytes);
      }
      else {
        uVar12 = 0;
        vx_00 = (uint8_t *)0x0;
        do {
          uVar2 = local_808[uVar12];
          vy = vx_00;
          if ((uVar2 < uVar8) && (pPVar9[uVar2].Mark == '\x01')) {
            uVar4 = this->_block_bytes;
            vy = local_860 + uVar2 * uVar4;
            if (vx_00 != (uint8_t *)0x0) {
              if (vx_00 == vx) {
                gf256_add_mem(vx,vy,uVar4);
                vy = vx_00;
              }
              else {
                gf256_addset_mem(vx,vx_00,vy,uVar4);
                vy = vx;
              }
            }
          }
          uVar12 = uVar12 + 1;
          vx_00 = vy;
        } while (uVar5 != uVar12);
        if (vy == (uint8_t *)0x0) goto LAB_00104b1b;
        if (vy != vx) {
          memcpy(vx,vy,(ulong)this->_block_bytes);
        }
        if (this->_ge_row_map[local_418] != 0xffff) {
          gf256_add_mem(this->_recovery_blocks +
                        (uint)this->_ge_row_map[local_418] * this->_block_bytes,vx,
                        this->_block_bytes);
        }
      }
      ShuffleDeck16(&local_840,local_808,uVar10);
      puVar14 = local_416;
      if (1 < (ushort)uVar13) {
        puVar11 = local_808;
        uVar13 = local_830;
        do {
          uVar2 = *puVar11;
          uVar3 = puVar11[uVar5];
          uVar4 = (uint)uVar3;
          if ((uVar2 < uVar8) && (pPVar9[uVar2].Mark == '\x01')) {
            if ((uVar3 < uVar8) && (pPVar9[uVar3].Mark == '\x01')) {
              uVar7 = this->_block_bytes;
              gf256_add2_mem(vx,local_860 + uVar2 * uVar7,local_860 + uVar4 * uVar7,uVar7);
            }
            else {
              uVar7 = this->_block_bytes;
              uVar4 = uVar2 * uVar7;
LAB_00104bd9:
              gf256_add_mem(vx,local_860 + uVar4,uVar7);
            }
          }
          else if ((uVar4 < uVar8) && (pPVar9[uVar3].Mark == '\x01')) {
            uVar7 = this->_block_bytes;
            uVar4 = uVar4 * uVar7;
            goto LAB_00104bd9;
          }
          if (this->_ge_row_map[*puVar14] != 0xffff) {
            gf256_add_mem(this->_recovery_blocks +
                          (uint)this->_ge_row_map[*puVar14] * this->_block_bytes,vx,
                          this->_block_bytes);
          }
          puVar14 = puVar14 + 1;
          puVar11 = puVar11 + 1;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar13 = local_820;
      uVar10 = (uint32_t)local_820;
      ShuffleDeck16(&local_840,local_808,uVar10);
      if (uVar6 != 0) {
        uVar12 = 0;
        do {
          uVar2 = local_808[uVar12];
          uVar3 = *(ushort *)(local_810 + uVar12 * 2);
          uVar4 = (uint)uVar3;
          if ((uVar2 < uVar8) && (pPVar9[uVar2].Mark == '\x01')) {
            if ((uVar3 < uVar8) && (pPVar9[uVar3].Mark == '\x01')) {
              uVar7 = this->_block_bytes;
              gf256_add2_mem(vx,local_860 + uVar2 * uVar7,local_860 + uVar4 * uVar7,uVar7);
            }
            else {
              uVar7 = this->_block_bytes;
              uVar4 = uVar2 * uVar7;
LAB_00104cc4:
              gf256_add_mem(vx,local_860 + uVar4,uVar7);
            }
          }
          else if ((uVar4 < uVar8) && (pPVar9[uVar3].Mark == '\x01')) {
            uVar7 = this->_block_bytes;
            uVar4 = uVar4 * uVar7;
            goto LAB_00104cc4;
          }
          if (this->_ge_row_map[puVar14[uVar12]] != 0xffff) {
            gf256_add_mem(this->_recovery_blocks +
                          (uint)this->_ge_row_map[puVar14[uVar12]] * this->_block_bytes,vx,
                          this->_block_bytes);
          }
          uVar12 = uVar12 + 1;
        } while (uVar6 != uVar12);
      }
      pPVar9 = (PeelColumn *)(&pPVar9->Next + local_828);
      local_860 = local_860 + this->_block_bytes * uVar10;
      uVar4 = (uint)(ushort)local_818;
    } while (uVar4 < local_854);
  }
  return;
}

Assistant:

void Codec::MultiplyDenseValues()
{
    CAT_IF_DUMP(cout << endl << "---- MultiplyDenseValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    // Initialize PRNG
    PCGRandom prng;
    prng.Seed(_d_seed);

    const uint16_t dense_count = _dense_count;
    CAT_DEBUG_ASSERT((unsigned)(_block_count + _mix_count) < _recovery_rows);
    uint8_t * GF256_RESTRICT temp_block = _recovery_blocks + _block_bytes * (_block_count + _mix_count);
    const uint8_t * GF256_RESTRICT source_block = _recovery_blocks;
    const PeelColumn * GF256_RESTRICT column = _peel_cols;
    uint16_t rows[CAT_MAX_DENSE_ROWS];
    uint16_t bits[CAT_MAX_DENSE_ROWS];
    const uint16_t block_count = _block_count;

    // For each block of columns:
    for (uint16_t column_i = 0; column_i < block_count; column_i += dense_count,
        column += dense_count, source_block += _block_bytes * dense_count)
    {
        unsigned max_x = dense_count;

        // Handle final columns
        if (column_i + dense_count > block_count) {
            max_x = _block_count - column_i;
        }

        CAT_IF_DUMP(cout << endl << "For window of columns between " << column_i <<
            " and " << column_i + dense_count - 1 << " (inclusive):" << endl;)

        // Shuffle row and bit order
        ShuffleDeck16(prng, rows, dense_count);
        ShuffleDeck16(prng, bits, dense_count);

        // Initialize counters
        const uint16_t set_count = (dense_count + 1) >> 1;
        uint16_t * GF256_RESTRICT set_bits = bits;
        uint16_t * GF256_RESTRICT clr_bits = set_bits + set_count;
        const uint16_t * GF256_RESTRICT row = rows;

        CAT_IF_DUMP(cout << "Generating first row " << _ge_row_map[*row] << ":";)

        // Generate first row
        const uint8_t * GF256_RESTRICT combo = 0;
        CAT_IF_ROWOP(++rowops;)

        for (unsigned ii = 0; ii < set_count; ++ii)
        {
            unsigned bit_i = set_bits[ii];

            // If bit is peeled:
            if (bit_i < max_x && column[bit_i].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit_i;)

                const uint8_t * GF256_RESTRICT src = source_block + _block_bytes * bit_i;

                // If no combo used yet:
                if (!combo) {
                    combo = src;
                }
                else if (combo == temp_block)
                {
                    // Else if combo has been used: XOR it in
                    gf256_add_mem(temp_block, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)
                }
                else
                {
                    // Else if combo needs to be used: Combine into block
                    gf256_addset_mem(temp_block, combo, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)

                    combo = temp_block;
                }
            }
        }

        CAT_IF_DUMP(cout << endl;)

        // If no combo ever triggered:
        if (!combo) {
            memset(temp_block, 0, _block_bytes);
        }
        else
        {
            // Else if never combined two: Just copy it
            if (combo != temp_block)
            {
                memcpy(temp_block, combo, _block_bytes);
                CAT_IF_ROWOP(++rowops;)
            }

            const uint16_t dest_column_i = _ge_row_map[*row];

            // Store in destination column in recovery blocks
            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
                gf256_add_mem(_recovery_blocks + _block_bytes * dest_column_i, temp_block, _block_bytes);
                CAT_IF_ROWOP(++rowops;)
            }
        }

        ++row;

        // Reshuffle bit order: Shuffle-2 Code
        ShuffleDeck16(prng, bits, dense_count);

        const unsigned loop_count = (dense_count >> 1);
        CAT_DEBUG_ASSERT(loop_count < CAT_MAX_DENSE_ROWS);

        // Generate first half of rows
        for (unsigned ii = 0; ii < loop_count; ++ii)
        {
            CAT_IF_DUMP(cout << "Flipping bits for derivative row " << _ge_row_map[*row] << ":";)

            CAT_DEBUG_ASSERT(ii < CAT_MAX_DENSE_ROWS);
            const unsigned bit0 = set_bits[ii];
            const unsigned bit1 = clr_bits[ii];

            // Add in peeled columns
            if (bit0 < max_x && column[bit0].Mark == MARK_PEEL)
            {
                if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0 << "+" << column_i + bit1;)

                    gf256_add2_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        source_block + _block_bytes * bit1,
                        _block_bytes);
                }
                else
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0;)

                    gf256_add_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        _block_bytes);
                }
                CAT_IF_ROWOP(++rowops;)
            }
            else if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit1;)

                gf256_add_mem(
                    temp_block,
                    source_block + _block_bytes * bit1,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }

            CAT_IF_DUMP(cout << endl;)

            const uint16_t dest_column_i = _ge_row_map[*row++];

            // Store in destination column in recovery blocks
            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);

                gf256_add_mem(
                    _recovery_blocks + _block_bytes * dest_column_i,
                    temp_block,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }
        }

        // Reshuffle bit order: Shuffle-2 Code
        ShuffleDeck16(prng, bits, dense_count);

        const unsigned second_loop_count = loop_count - 1 + (dense_count & 1);
        CAT_DEBUG_ASSERT(second_loop_count < CAT_MAX_DENSE_ROWS);

        // Generate second half of rows
        for (unsigned ii = 0; ii < second_loop_count; ++ii)
        {
            CAT_IF_DUMP(cout << "Flipping bits for derivative row " << _ge_row_map[*row] << ":";)

            // Add in peeled columns
            CAT_DEBUG_ASSERT(ii < CAT_MAX_DENSE_ROWS);
            const unsigned bit0 = set_bits[ii];
            const unsigned bit1 = clr_bits[ii];

            if (bit0 < max_x && column[bit0].Mark == MARK_PEEL)
            {
                if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0 << "+" << column_i + bit1;)

                    CAT_DEBUG_ASSERT(bit0 < _block_count);
                    CAT_DEBUG_ASSERT(bit1 < _block_count);

                    gf256_add2_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        source_block + _block_bytes * bit1,
                        _block_bytes);
                }
                else
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0;)

                    CAT_DEBUG_ASSERT(bit0 < _block_count);

                    gf256_add_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        _block_bytes);
                }

                CAT_IF_ROWOP(++rowops;)
            }
            else if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit1;)

                CAT_DEBUG_ASSERT(bit1 < _block_count);

                gf256_add_mem(
                    temp_block,
                    source_block + _block_bytes * bit1,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }

            CAT_IF_DUMP(cout << endl;)

            // Store in destination column in recovery blocks
            const uint16_t dest_column_i = _ge_row_map[*row++];

            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);

                gf256_add_mem(
                    _recovery_blocks + _block_bytes * dest_column_i,
                    temp_block,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }
        }
    } // next column

    CAT_IF_ROWOP(cout << "MultiplyDenseValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}